

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QtPrivate::argToQString
          (QString *__return_storage_ptr__,QtPrivate *this,QAnyStringView pattern,size_t numArgs,
          ArgBase **args)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  QUtf8 *pQVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 asize;
  char **ppcVar7;
  ulong uVar8;
  char16_t *dst;
  char *pcVar9;
  char *pcVar10;
  char **ppcVar11;
  qsizetype size;
  char16_t *this_00;
  long lVar12;
  char **ppcVar13;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  Part *part;
  QVLAStorage<24UL,_8UL,_32LL> *pQVar15;
  char16_t *dst_00;
  long lVar16;
  long in_FS_OFFSET;
  QByteArrayView in;
  QAnyStringView string;
  qsizetype i;
  ArgIndexToPlaceholderMap result;
  ParseResult parts;
  QString local_3e0;
  QMessageLogger local_3c8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3a0;
  char **local_398;
  char *local_390;
  undefined1 *puStack_388;
  undefined1 *local_380;
  undefined1 *puStack_378;
  undefined1 *local_370;
  undefined1 *puStack_368;
  undefined1 *local_360;
  undefined1 *puStack_358;
  QVarLengthArray<(anonymous_namespace)::Part,_32LL> local_350;
  long local_38;
  
  asize = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)pattern.m_size;
  string.field_0 = pattern.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_350,0xaa,0x318);
  ppcVar7 = (char **)0x3fffffffffffffff;
  uVar8 = (ulong)string.field_0.m_data & 0x3fffffffffffffff;
  local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr =
       &local_350.super_QVLAStorage<24UL,_8UL,_32LL>;
  lVar16 = uVar8 - 1;
  if (((ulong)string.field_0.m_data & 0xc000000000000000) == 0x4000000000000000) {
    memset(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,0xaa,0x300);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    pcVar10 = (char *)0x0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    local_3c8.context._0_8_ = (char *)0x0;
    if (1 < uVar8) {
      pcVar10 = (char *)0x0;
      pcVar9 = pcVar10;
      pcVar5 = (char *)local_3c8.context._0_8_;
      do {
        while (local_3c8.context._0_8_ = pcVar9, this[(long)pcVar9] != (QtPrivate)0x25) {
LAB_003312f6:
          local_3c8.context._0_8_ = local_3c8.context._0_8_ + 1;
          pcVar9 = (char *)local_3c8.context._0_8_;
          pcVar5 = (char *)local_3c8.context._0_8_;
          if (lVar16 <= (long)local_3c8.context._0_8_) goto LAB_003313b5;
        }
        local_3c8.context._0_8_ = pcVar5;
        iVar3 = getEscape<char>((char *)this,(qsizetype *)&local_3c8,uVar8);
        if (iVar3 == -1) goto LAB_003312f6;
        if ((long)pcVar9 - (long)pcVar10 != 0) {
          local_3a8.m_data_utf8 = (char *)(this + pcVar10);
          local_3a0.m_data = (void *)((long)pcVar9 - (long)pcVar10 | 0x4000000000000000);
          local_398 = (char **)CONCAT44(local_398._4_4_,0xffffffff);
          QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                    (&local_350,(Part *)&local_3a8);
        }
        pcVar10 = (char *)local_3c8.context._0_8_;
        local_3a8.m_data_utf8 = (char *)(this + pcVar9);
        ppcVar7 = (char **)((long)pcVar10 - (long)pcVar9 | 0x4000000000000000);
        local_398 = (char **)CONCAT44(local_398._4_4_,iVar3);
        local_3a0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)ppcVar7;
        local_3c8.context._0_8_ = pcVar10;
        QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8)
        ;
        pcVar9 = pcVar10;
        pcVar5 = (char *)local_3c8.context._0_8_;
      } while ((long)pcVar10 < lVar16);
    }
LAB_003313b5:
    if (uVar8 - (long)pcVar10 != 0 && (long)pcVar10 <= (long)uVar8) {
      local_3a8.m_data_utf8 = (char *)(this + pcVar10);
      local_3a0.m_data = (void *)(uVar8 - (long)pcVar10 | 0x4000000000000000);
      local_398 = (char **)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  else {
    memset(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,0xaa,0x300);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    pcVar10 = (char *)0x0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    local_3c8.context._0_8_ = (char *)0x0;
    if (1 < uVar8) {
      pcVar10 = (char *)0x0;
      pcVar9 = pcVar10;
      pcVar5 = (char *)local_3c8.context._0_8_;
      do {
        while (local_3c8.context._0_8_ = pcVar9, this[(long)pcVar9] != (QtPrivate)0x25) {
LAB_00331462:
          local_3c8.context._0_8_ = local_3c8.context._0_8_ + 1;
          pcVar9 = (char *)local_3c8.context._0_8_;
          pcVar5 = (char *)local_3c8.context._0_8_;
          if (lVar16 <= (long)local_3c8.context._0_8_) goto LAB_00331553;
        }
        local_3c8.context._0_8_ = pcVar5;
        iVar3 = getEscape<char>((char *)this,(qsizetype *)&local_3c8,uVar8);
        if (iVar3 == -1) goto LAB_00331462;
        local_3a0.m_data_utf8 = pcVar9 - pcVar10;
        if (local_3a0.m_data != (void *)0x0) {
          local_3a8.m_data_utf8 = (char *)(this + pcVar10);
          local_398 = (char **)CONCAT44(local_398._4_4_,0xffffffff);
          QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                    (&local_350,(Part *)&local_3a8);
        }
        pcVar10 = (char *)local_3c8.context._0_8_;
        local_3a8.m_data_utf8 = (char *)(this + pcVar9);
        ppcVar7 = (char **)(pcVar10 + -(long)pcVar9);
        local_398 = (char **)CONCAT44(local_398._4_4_,iVar3);
        local_3a0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)ppcVar7;
        local_3c8.context._0_8_ = pcVar10;
        QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8)
        ;
        pcVar9 = pcVar10;
        pcVar5 = (char *)local_3c8.context._0_8_;
      } while ((long)pcVar10 < lVar16);
    }
LAB_00331553:
    local_3a0.m_data_utf8 = uVar8 - pcVar10;
    if (local_3a0.m_data != (void *)0x0 && (long)pcVar10 <= (long)uVar8) {
      local_3a8.m_data_utf8 = (char *)(this + pcVar10);
      local_398 = (char **)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  local_390 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_388 = &DAT_aaaaaaaaaaaaaaaa;
  local_380 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_378 = &DAT_aaaaaaaaaaaaaaaa;
  local_370 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_368 = &DAT_aaaaaaaaaaaaaaaa;
  local_360 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_358 = &DAT_aaaaaaaaaaaaaaaa;
  local_3a8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x10;
  local_3a0.m_data = (void *)0x0;
  ppcVar11 = &local_390;
  ppcVar13 = &local_390;
  local_398 = &local_390;
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s != 0) {
    lVar16 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    ppcVar11 = (char **)((char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.
                                 super_QVLABaseBase.ptr + 0x10);
    pcVar10 = (char *)local_3c8.context._0_8_;
    do {
      local_3c8.context.line = (int)((ulong)pcVar10 >> 0x20);
      local_3c8.context.version = *(int *)ppcVar11;
      if (-1 < local_3c8.context.version) {
        if (local_3a0.m_data == local_3a8.m_data) {
          ppcVar7 = (char **)&local_3c8;
          QVLABase<int>::emplace_back_impl<int>
                    ((QVLABase<int> *)&local_3a8,0x10,&local_390,(int *)&local_3c8);
          pcVar10 = (char *)CONCAT44(local_3c8.context.line,local_3c8.context.version);
        }
        else {
          ppcVar7 = ppcVar11;
          local_3c8.context._0_8_ = pcVar10;
          QVLABase<int>::emplace_back_impl<int_const&>
                    ((QVLABase<int> *)&local_3a8,0x10,&local_390,(int *)ppcVar11);
          pcVar10 = (char *)local_3c8.context._0_8_;
        }
      }
      local_3c8.context._0_8_ = pcVar10;
      ppcVar13 = local_398;
      ppcVar11 = ppcVar11 + 3;
      lVar16 = lVar16 + -0x18;
      pcVar10 = (char *)local_3c8.context._0_8_;
    } while (lVar16 != 0);
    ppcVar11 = local_398;
    if (local_3a0.m_data != (void *)0x0) {
      piVar4 = (int *)((long)local_398 + (long)local_3a0.m_data * 4);
      lVar16 = 0x3f;
      if (local_3a0.m_data != (void *)0x0) {
        for (; (ulong)local_3a0.m_data >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_398,piVar4,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(ppcVar13,piVar4);
      ppcVar11 = (char **)((long)local_398 + (long)local_3a0.m_data * 4);
      ppcVar7 = local_398;
      ppcVar13 = ppcVar11;
      if (local_3a0.m_data != (void *)0x0) {
        lVar16 = 4;
        do {
          lVar12 = lVar16;
          if ((long)local_3a0.m_data << 2 == lVar12) goto LAB_003316f0;
          iVar3 = *(int *)((long)local_398 + lVar12 + -4);
          lVar16 = lVar12 + 4;
        } while (iVar3 != *(int *)((long)local_398 + lVar12));
        lVar12 = (long)local_398 + lVar12 + -4;
        for (; (long)local_3a0.m_data << 2 != lVar16; lVar16 = lVar16 + 4) {
          iVar2 = *(int *)((long)local_398 + lVar16);
          if (iVar3 != iVar2) {
            *(int *)(lVar12 + 4) = iVar2;
            lVar12 = lVar12 + 4;
          }
          iVar3 = iVar2;
        }
        ppcVar13 = (char **)(lVar12 + 4);
      }
    }
  }
LAB_003316f0:
  QVLABase<int>::erase
            ((QVLABase<int> *)&local_3a8,(const_iterator)ppcVar13,(const_iterator)ppcVar11);
  aVar14 = local_3a0;
  if (asize.m_data < local_3a0.m_data) {
    aVar14 = local_3a8;
    if ((long)local_3a8.m_data <= (long)asize.m_data) {
      aVar14 = asize;
    }
    QVLABase<int>::reallocate_impl
              ((QVLABase<int> *)&local_3a8,0x10,&local_390,(qsizetype)asize,(qsizetype)aVar14);
    local_3a0 = asize;
  }
  else if (local_3a0.m_data < asize.m_data) {
    local_3c8.context.version = 2;
    local_3c8.context.line = 0;
    local_3c8.context.file._0_4_ = 0;
    local_3c8.context._12_8_ = 0;
    local_3c8.context.function._4_4_ = 0;
    local_3c8.context.category = "default";
    string.m_size = (size_t)ppcVar7;
    convertToQString(&local_3e0,this,string);
    if (local_3e0.d.d == (Data *)0x0) {
      QString::reallocData(&local_3e0,local_3e0.d.size,KeepSize);
    }
    QMessageLogger::warning
              (&local_3c8,"QString::arg: %d argument(s) missing in %ls",
               (ulong)(uint)((int)pattern.m_size - aVar14._0_4_),local_3e0.d.ptr);
    argToQString((QtPrivate *)&local_3e0);
  }
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s == 0) {
    size = 0;
  }
  else {
    lVar16 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    pcVar10 = (char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr +
              0x10;
    size = 0;
    do {
      if (*(int *)pcVar10 != -1) {
        piVar4 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_398,(int *)((long)local_398 + (long)local_3a0.m_data * 4),pcVar10)
        ;
        if (piVar4 != (int *)((long)local_398 + (long)local_3a0.m_data * 4)) {
          pcVar5 = *(char **)(numArgs + ((long)piVar4 - (long)local_398) * 2);
          cVar1 = *pcVar5;
          if (cVar1 == '\x02') {
            uVar8 = *(ulong *)(pcVar5 + 8) | 0x8000000000000000;
LAB_003317f6:
            pcVar5 = pcVar5 + 0x10;
          }
          else {
            if (cVar1 != '\x01') {
              if (cVar1 != '\0') goto LAB_00331807;
              uVar8 = *(ulong *)(pcVar5 + 8) | 0x4000000000000000;
              goto LAB_003317f6;
            }
            uVar8 = *(ulong *)(pcVar5 + 0x10);
            pcVar5 = pcVar5 + 8;
          }
          *(undefined8 *)((QVLAStorage<24UL,_8UL,_32LL> *)(pcVar10 + -0x10))->array =
               *(undefined8 *)pcVar5;
          *(ulong *)(pcVar10 + -8) = uVar8;
        }
      }
LAB_00331807:
      size = size + (*(ulong *)(pcVar10 + -8) & 0x3fffffffffffffff);
      pcVar10 = pcVar10 + 0x18;
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != 0);
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,size,Uninitialized);
  pQVar6 = (QUtf8 *)(__return_storage_ptr__->d).ptr;
  this_00 = (char16_t *)pQVar6;
  if (pQVar6 == (QUtf8 *)0x0) {
    this_00 = &QString::_empty;
  }
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s != 0) {
    lVar16 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    pcVar10 = (char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr;
    pQVar15 = (QVLAStorage<24UL,_8UL,_32LL> *)
              local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr;
    do {
      uVar8 = *(ulong *)(pQVar15->array + 8) & 0xc000000000000000;
      dst_00 = (char16_t *)(*(ulong *)(pQVar15->array + 8) & 0x3fffffffffffffff);
      if (uVar8 == 0x4000000000000000) {
        if (dst_00 != (char16_t *)0x0) {
          qt_from_latin1(this_00,*(char **)pQVar15->array,(size_t)dst_00);
        }
        this_00 = (char16_t *)((long)this_00 + (long)dst_00 * 2);
      }
      else {
        in.m_data = (storage_type *)-uVar8;
        in.m_size = (qsizetype)*(char **)pQVar15->array;
        this_00 = QUtf8::convertToUnicode((QUtf8 *)this_00,dst_00,in);
      }
      pQVar15 = (QVLAStorage<24UL,_8UL,_32LL> *)(pQVar15->array + 0x18);
    } while (pQVar15 != (QVLAStorage<24UL,_8UL,_32LL> *)(pcVar10 + lVar16));
    pQVar6 = (QUtf8 *)(__return_storage_ptr__->d).ptr;
  }
  lVar16 = (long)this_00 - (long)pQVar6 >> 1;
  if (lVar16 < (__return_storage_ptr__->d).size) {
    QString::resize(__return_storage_ptr__,lVar16);
  }
  if (local_398 != &local_390) {
    sizedFree(local_398,(long)local_3a8.m_data << 2);
  }
  if ((QVLAStorage<24UL,_8UL,_32LL> *)
      local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr !=
      &local_350.super_QVLAStorage<24UL,_8UL,_32LL>) {
    sizedFree(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,
              local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a * 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QtPrivate::argToQString(QAnyStringView pattern, size_t numArgs, const ArgBase **args)
{
    // Step 1-2 above
    ParseResult parts = parseMultiArgFormatString(pattern);

    // 3-4
    ArgIndexToPlaceholderMap argIndexToPlaceholderMap = makeArgIndexToPlaceholderMap(parts);

    if (static_cast<size_t>(argIndexToPlaceholderMap.size()) > numArgs) // 3a
        argIndexToPlaceholderMap.resize(qsizetype(numArgs));
    else if (Q_UNLIKELY(static_cast<size_t>(argIndexToPlaceholderMap.size()) < numArgs)) // 3b
        qWarning("QString::arg: %d argument(s) missing in %ls",
                 int(numArgs - argIndexToPlaceholderMap.size()), qUtf16Printable(pattern.toString()));

    // 5
    const qsizetype totalSize = resolveStringRefsAndReturnTotalSize(parts, argIndexToPlaceholderMap, args);

    // 6:
    QString result(totalSize, Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData());

    struct Concatenate {
        QChar *out;
        QChar *operator()(QLatin1String part) noexcept
        {
            if (part.size()) {
                qt_from_latin1(reinterpret_cast<char16_t*>(out),
                               part.data(), part.size());
            }
            return out + part.size();
        }
        QChar *operator()(QUtf8StringView part) noexcept
        {
            return QUtf8::convertToUnicode(out, part);
        }
        QChar *operator()(QStringView part) noexcept
        {
            if (part.size())
                memcpy(out, part.data(), part.size() * sizeof(QChar));
            return out + part.size();
        }
    };

    for (const Part &part : parts)
        out = part.string.visit(Concatenate{out});

    // UTF-8 decoding may have caused an overestimate of totalSize - correct it:
    result.truncate(out - result.cbegin());

    return result;
}